

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool __thiscall bloaty::ArgParser::TryParseIntegerOption(ArgParser *this,string_view flag,int *val)

{
  bool bVar1;
  bool bVar2;
  int in_R8D;
  Arg *in_R9;
  string_view format;
  string_view text;
  string_view val_str;
  int32_t val_1;
  string_view local_b8;
  string local_a8;
  size_t local_88;
  char *local_80;
  Arg local_58;
  
  local_b8._M_len = 0;
  local_b8._M_str = (char *)0x0;
  bVar1 = TryParseOption(this,flag,&local_b8);
  if (bVar1) {
    text._M_str = (char *)&local_88;
    text._M_len = (size_t)local_b8._M_str;
    bVar2 = absl::numbers_internal::safe_strto32_base
                      ((numbers_internal *)local_b8._M_len,text,(Nonnull<int32_t_*>)0xa,in_R8D);
    *val = (int)local_88;
    if (!bVar2) {
      local_58.piece_._M_len = local_b8._M_len;
      local_58.piece_._M_str = local_b8._M_str;
      format._M_str = (char *)&local_88;
      format._M_len = (size_t)"option \'$0\' had non-integral argument: $1";
      local_88 = flag._M_len;
      local_80 = flag._M_str;
      absl::Substitute_abi_cxx11_(&local_a8,(absl *)0x29,format,&local_58,in_R9);
      Throw(local_a8._M_dataplus._M_p,0x827);
    }
  }
  return bVar1;
}

Assistant:

bool TryParseIntegerOption(string_view flag, int* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    if (!absl::SimpleAtoi(val_str, val)) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }